

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O1

Interval *
tcu::applyMonotone(Interval *__return_storage_ptr__,DoubleIntervalFunc2 *func,Interval *arg0,
                  Interval *arg1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 uVar6;
  ulong uVar7;
  Interval local_88;
  Interval local_70;
  Interval local_58;
  Interval local_40;
  
  dVar1 = arg0->m_lo;
  dVar2 = arg0->m_hi;
  dVar3 = arg1->m_lo;
  dVar4 = arg1->m_hi;
  (*func)(&local_40,dVar1,dVar3);
  (*func)(&local_58,dVar1,dVar4);
  dVar1 = (double)(~-(ulong)(local_40.m_lo <= local_58.m_lo) & (ulong)local_58.m_lo |
                  (ulong)local_40.m_lo & -(ulong)(local_40.m_lo <= local_58.m_lo));
  dVar5 = (double)(~-(ulong)(local_58.m_hi <= local_40.m_hi) & (ulong)local_58.m_hi |
                  (ulong)local_40.m_hi & -(ulong)(local_58.m_hi <= local_40.m_hi));
  (*func)(&local_70,dVar2,dVar3);
  (*func)(&local_88,dVar2,dVar4);
  dVar2 = (double)(~-(ulong)(local_70.m_lo <= local_88.m_lo) & (ulong)local_88.m_lo |
                  (ulong)local_70.m_lo & -(ulong)(local_70.m_lo <= local_88.m_lo));
  dVar3 = (double)(~-(ulong)(local_88.m_hi <= local_70.m_hi) & (ulong)local_88.m_hi |
                  (ulong)local_70.m_hi & -(ulong)(local_88.m_hi <= local_70.m_hi));
  uVar6 = 1;
  if ((local_70.m_hasNaN & 1U) == 0) {
    uVar6 = local_88.m_hasNaN;
  }
  if (((local_58.m_hasNaN | local_40.m_hasNaN) & 1U) != 0) {
    uVar6 = true;
  }
  __return_storage_ptr__->m_hasNaN = (bool)uVar6;
  uVar7 = -(ulong)(dVar1 <= dVar2);
  __return_storage_ptr__->m_lo = (double)(~uVar7 & (ulong)dVar2 | uVar7 & (ulong)dVar1);
  uVar7 = -(ulong)(dVar3 <= dVar5);
  __return_storage_ptr__->m_hi = (double)(~uVar7 & (ulong)dVar3 | uVar7 & (ulong)dVar5);
  return __return_storage_ptr__;
}

Assistant:

Interval applyMonotone (DoubleIntervalFunc2& func, const Interval& arg0, const Interval& arg1)
{
	double	lo0 = arg0.lo(), hi0 = arg0.hi(), lo1 = arg1.lo(), hi1 = arg1.hi();
	return Interval(Interval(func(lo0, lo1), func(lo0, hi1)),
					Interval(func(hi0, lo1), func(hi0, hi1)));
}